

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

void __thiscall nuraft::raft_server::set_config(raft_server *this,ptr<cluster_config> *new_config)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->config_lock_);
  if (iVar1 == 0) {
    (this->stale_config_).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (this->config_).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    __r = &(this->config_).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->stale_config_).
                super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               __r);
    (this->config_).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (new_config->super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (__r,&(new_config->
                    super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount);
    pthread_mutex_unlock((pthread_mutex_t *)&this->config_lock_);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void raft_server::set_config(const ptr<cluster_config>& new_config) {
    std::lock_guard<std::mutex> l(config_lock_);
    stale_config_ = config_;
    config_ = new_config;
}